

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  float fVar1;
  int iVar2;
  ImGuiTable *pIVar3;
  bool bVar4;
  ImGuiListClipper *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  float in_stack_00000010;
  int already_submitted;
  float pos_y2;
  float pos_y1;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *in_stack_000000c0;
  ImGuiWindow *pIVar5;
  
  pIVar5 = GImGui->CurrentWindow;
  pIVar3 = GImGui->CurrentTable;
  if ((pIVar3 != (ImGuiTable *)0x0) && ((pIVar3->IsInsideRow & 1U) != 0)) {
    ImGui::TableEndRow(in_stack_000000c0);
  }
  if ((in_RDI->ItemsCount == 0) || (bVar4 = GetSkipItemForListClipping(), bVar4)) {
    End(in_RDI);
    return false;
  }
  if (in_RDI->StepNo == 0) {
    if ((pIVar3 != (ImGuiTable *)0x0) && ((pIVar3->IsUnfrozenRows & 1U) == 0)) {
      in_RDI->DisplayStart = in_RDI->ItemsFrozen;
      in_RDI->DisplayEnd = in_RDI->ItemsFrozen + 1;
      in_RDI->ItemsFrozen = in_RDI->ItemsFrozen + 1;
      return true;
    }
    in_RDI->StartPosY = (pIVar5->DC).CursorPos.y;
    if (in_RDI->ItemsHeight <= 0.0) {
      in_RDI->DisplayStart = in_RDI->ItemsFrozen;
      in_RDI->DisplayEnd = in_RDI->ItemsFrozen + 1;
      in_RDI->StepNo = 1;
      return true;
    }
    in_RDI->DisplayStart = in_RDI->DisplayEnd;
    in_RDI->StepNo = 2;
  }
  if (in_RDI->StepNo == 1) {
    if (pIVar3 == (ImGuiTable *)0x0) {
      in_RDI->ItemsHeight = (pIVar5->DC).CursorPos.y - in_RDI->StartPosY;
    }
    else {
      fVar1 = pIVar3->RowPosY2;
      in_RDI->ItemsHeight = fVar1 - pIVar3->RowPosY1;
      (pIVar5->DC).CursorPos.y = fVar1;
    }
    in_RDI->StepNo = 2;
  }
  if (in_RDI->ItemsCount <= in_RDI->DisplayEnd) {
    End(in_RDI);
    return false;
  }
  if (in_RDI->StepNo == 2) {
    iVar2 = in_RDI->DisplayEnd;
    ImGui::CalcListClipping(already_submitted,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    in_RDI->DisplayStart = iVar2 + in_RDI->DisplayStart;
    in_RDI->DisplayEnd = iVar2 + in_RDI->DisplayEnd;
    if (iVar2 < in_RDI->DisplayStart) {
      SetCursorPosYAndSetupForPrevLine((float)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
    }
    in_RDI->StepNo = 3;
    return true;
  }
  if (in_RDI->StepNo == 3) {
    if (in_RDI->ItemsCount < 0x7fffffff) {
      SetCursorPosYAndSetupForPrevLine((float)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
    }
    in_RDI->ItemsCount = -1;
    return false;
  }
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
    {
        End();
        return false;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    if (StepNo == 0)
    {
        // While we are in frozen row state, keep displaying items one by one, unclipped
        // FIXME: Could be stored as a table-agnostic state.
        if (table != NULL && !table->IsUnfrozenRows)
        {
            DisplayStart = ItemsFrozen;
            DisplayEnd = ItemsFrozen + 1;
            ItemsFrozen++;
            return true;
        }

        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item so we can measure its height (generally it is 0..1)
            DisplayStart = ItemsFrozen;
            DisplayEnd = ItemsFrozen + 1;
            StepNo = 1;
            return true;
        }

        // Already has item height (given by user in Begin): skip to calculating step
        DisplayStart = DisplayEnd;
        StepNo = 2;
    }

    // Step 1: the clipper infer height from first element
    if (StepNo == 1)
    {
        IM_ASSERT(ItemsHeight <= 0.0f);
        if (table)
        {
            const float pos_y1 = table->RowPosY1;   // Using this instead of StartPosY to handle clipper straddling the frozen row
            const float pos_y2 = table->RowPosY2;   // Using this instead of CursorPos.y to take account of tallest cell.
            ItemsHeight = pos_y2 - pos_y1;
            window->DC.CursorPos.y = pos_y2;
        }
        else
        {
            ItemsHeight = window->DC.CursorPos.y - StartPosY;
        }
        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        StepNo = 2;
    }

    // Reached end of list
    if (DisplayEnd >= ItemsCount)
    {
        End();
        return false;
    }

    // Step 2: calculate the actual range of elements to display, and position the cursor before the first element
    if (StepNo == 2)
    {
        IM_ASSERT(ItemsHeight > 0.0f);

        int already_submitted = DisplayEnd;
        ImGui::CalcListClipping(ItemsCount - already_submitted, ItemsHeight, &DisplayStart, &DisplayEnd);
        DisplayStart += already_submitted;
        DisplayEnd += already_submitted;

        // Seek cursor
        if (DisplayStart > already_submitted)
            SetCursorPosYAndSetupForPrevLine(StartPosY + (DisplayStart - ItemsFrozen) * ItemsHeight, ItemsHeight);

        StepNo = 3;
        return true;
    }

    // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (StepNo == 3)
    {
        // Seek cursor
        if (ItemsCount < INT_MAX)
            SetCursorPosYAndSetupForPrevLine(StartPosY + (ItemsCount - ItemsFrozen) * ItemsHeight, ItemsHeight); // advance cursor
        ItemsCount = -1;
        return false;
    }

    IM_ASSERT(0);
    return false;
}